

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZProjectEllipse.cpp
# Opt level: O1

void __thiscall
TPZProjectEllipse::PrintAxes(TPZProjectEllipse *this,TPZFMatrix<double> *P,ostream *out)

{
  long lVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  double extraout_XMM0_Qa;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"\nPrinting axes of the ellipse:\n",0x1f);
  AlmostZeroToZero(this,P);
  if (0 < (P->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol) {
    lVar4 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(out,"Vector",6);
      lVar1 = lVar4 + 1;
      poVar2 = (ostream *)std::ostream::operator<<(out,(int)lVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," = ( ",5);
      if (0 < (P->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow) {
        lVar3 = 0;
        do {
          if (lVar3 != 0) {
            std::__ostream_insert<char,std::char_traits<char>>(out," , ",3);
          }
          (*(P->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x24]
          )(P,lVar3,lVar4);
          std::ostream::_M_insert<double>(extraout_XMM0_Qa);
          lVar3 = lVar3 + 1;
        } while (lVar3 < (P->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out," )\n",3);
      lVar4 = lVar1;
    } while (lVar1 < (P->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol);
  }
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
  std::ostream::put((char)out);
  std::ostream::flush();
  return;
}

Assistant:

void TPZProjectEllipse::PrintAxes(TPZFMatrix<REAL> &P,std::ostream &out) {
	out << "\nPrinting axes of the ellipse:\n";
	AlmostZeroToZero(P);
	for(int i=0;i<P.Cols();i++) {
		out << "Vector" << i+1 << " = ( ";
		for(int j=0;j<P.Rows();j++) {
			if(j) out << " , ";
			out << P.GetVal(j,i);
		}
		out << " )\n";
	}
	out << std::endl;
}